

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O2

libcaption_stauts_t caption_frame_decode_preamble(caption_frame_t *frame,uint16_t cc_data)

{
  int iVar1;
  int uln;
  int col;
  int row;
  eia608_style_t sty;
  int chn;
  
  iVar1 = eia608_parse_preamble(cc_data,&row,&col,&sty,&chn,&uln);
  if (iVar1 != 0) {
    (frame->state).row = (int8_t)row;
    (frame->state).col = (int8_t)col;
    *(byte *)&frame->state =
         (byte)uln & 1 | *(byte *)&frame->state & 0xf0 | (undefined1)sty * '\x02' & 0xeU;
  }
  return LIBCAPTION_OK;
}

Assistant:

libcaption_stauts_t caption_frame_decode_preamble(caption_frame_t* frame, uint16_t cc_data)
{
    eia608_style_t sty;
    int row, col, chn, uln;

    if (eia608_parse_preamble(cc_data, &row, &col, &sty, &chn, &uln)) {
        frame->state.row = row;
        frame->state.col = col;
        frame->state.sty = sty;
        frame->state.uln = uln;
    }

    return LIBCAPTION_OK;
}